

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O0

int GetPressureMS580314BA(MS580314BA *pMS580314BA,double *pPressure)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double Pres;
  double TEMPE;
  double SENS2;
  double OFF2;
  double T2;
  double SENS;
  double P;
  double TEM;
  double dt;
  double OFF;
  unsigned_long D2;
  unsigned_long D1;
  double *pPressure_local;
  MS580314BA *pMS580314BA_local;
  
  D2 = 0;
  OFF = 0.0;
  D1 = (unsigned_long)pPressure;
  pPressure_local = (double *)pMS580314BA;
  WriteDataMS580314BA(pMS580314BA,'B');
  WriteDataMS580314BA((MS580314BA *)pPressure_local,'\0');
  ReadDataMS580314BA((MS580314BA *)pPressure_local,1,&D2);
  WriteDataMS580314BA((MS580314BA *)pPressure_local,'R');
  WriteDataMS580314BA((MS580314BA *)pPressure_local,'\0');
  ReadDataMS580314BA((MS580314BA *)pPressure_local,1,(unsigned_long *)&OFF);
  auVar4._8_4_ = (int)((ulong)OFF >> 0x20);
  auVar4._0_8_ = OFF;
  auVar4._12_4_ = 0x45300000;
  dVar1 = -pPressure_local[0x68] * 256.0 +
          (auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(OFF,0)) - 4503599627370496.0);
  dVar2 = (dVar1 * pPressure_local[0x69]) / 8388608.0 + 2000.0;
  if (2000.0 < dVar2) {
    SENS2 = ((dVar2 - 2000.0) * 1.0 * (dVar2 - 2000.0)) / 16.0;
    TEMPE = 0.0;
  }
  else {
    SENS2 = ((dVar2 - 2000.0) * 3.0 * (dVar2 - 2000.0)) / 2.0;
    TEMPE = ((dVar2 - 2000.0) * 5.0 * (dVar2 - 2000.0)) / 8.0;
  }
  if (dVar2 < -1500.0) {
    SENS2 = (dVar2 + 1500.0) * (dVar2 + 1500.0) * 7.0 + SENS2;
    TEMPE = (dVar2 + 1500.0) * (dVar2 + 1500.0) * 4.0 + TEMPE;
  }
  auVar3._8_4_ = (int)(D2 >> 0x20);
  auVar3._0_8_ = D2;
  auVar3._12_4_ = 0x45300000;
  if ((D2 == 0) || (OFF == 0.0)) {
    *(undefined8 *)D1 = *(undefined8 *)D1;
  }
  else {
    *(double *)D1 =
         ((((((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)D2) - 4503599627370496.0)) *
            ((pPressure_local[100] * 32768.0 + (pPressure_local[0x66] * dVar1) / 256.0) - TEMPE)) /
            2097152.0 -
           ((pPressure_local[0x65] * 65536.0 + (pPressure_local[0x67] * dVar1) / 128.0) - SENS2)) /
          32768.0) / 10.0) / 1000.0;
  }
  pPressure_local[0x6e] = *(double *)D1;
  return 0;
}

Assistant:

inline int GetPressureMS580314BA(MS580314BA* pMS580314BA, double* pPressure)
{
	unsigned long D1 = 0, D2 = 0;
	//double tim = 0, ini = 0, fin = 0;
	//double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, z = 0, zini = 0, TEMPE = 0, Pres = 0, zant = 0;
	double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, TEMPE = 0, Pres = 0;

	//double depth = Pressure2Height(*pPressure, pMS580314BA->PressureRef, pMS580314BA->WaterDensity); // ...

	// Missing error checking...

	WriteDataMS580314BA(pMS580314BA, 0x42); // Convert D1 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D1);

	WriteDataMS580314BA(pMS580314BA, 0x52); // Convert D2 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D2);

	dt = D2-pMS580314BA->Ca[5]*256;
	TEM = 2000+dt*pMS580314BA->Ca[6]/8388608;

	OFF = pMS580314BA->Ca[2]*65536;
	OFF = OFF+(pMS580314BA->Ca[4]*dt)/128;

	SENS = pMS580314BA->Ca[1]*32768;
	SENS = SENS+(pMS580314BA->Ca[3]*dt)/256;

	if (TEM <= 2000)
	{
		T2 = 3*(dt*dt);
		T2 = T2/8589934592.0;
		OFF2 = 3*(TEM-2000)*(TEM-2000)/2;
		SENS2 = 5*(TEM-2000)*(TEM-2000)/8;
	}
	else
	{
		T2 = 7*(dt*dt);
		T2 = T2/137438953472.0;
		OFF2 = 1*(TEM-2000)*(TEM-2000)/16;
		SENS2 = 0;
	}

	////Sleep(100);

	if (TEM < -1500)
	{
		OFF2 = OFF2+7*((TEM+1500)*(TEM+1500));
		SENS2 = SENS2+4*((TEM+1500)*(TEM+1500));
	}

	TEM = TEM-T2;
	OFF = OFF-OFF2;
	SENS = SENS-SENS2;

	P = (D1*SENS/2097152-OFF)/32768;

	Pres = P/10.0;
	TEMPE = TEM/100.0;

	//if (tim<1) { zini = (Pres*100)/9810; }
	//if (pMS580314BA->PressureIni == 0) { pMS580314BA->PressureIni = Pres; }

	if ((D1 == 0)||(D2 == 0))
	{
		//depth = depth;
		*pPressure = *pPressure; // ?
	}
	else
	{
		//depth = (Pres*100)/9810-(pMS580314BA->PressureRef*100)/9810;
		//*pPressure = (Pres-pMS580314BA->PressureIni)*(100.0/9810.0)*pMS580314BA->WaterDensity*STANDARD_GRAVITY/1e5;
		*pPressure = Pres/1000.0;
	}

	// ...

	//printf("*pPressure=%f,\n",*pPressure);

	//*pPressure = pMS580314BA->PressureRef-depth*(pMS580314BA->WaterDensity*STANDARD_GRAVITY)/1e5;

	pMS580314BA->LastPressure = *pPressure;

	return EXIT_SUCCESS;
}